

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memwatch.c
# Opt level: O3

void mwUnlink(mwData *mw,char *file,int line)

{
  mwData *pmVar1;
  mwData *pmVar2;
  
  pmVar1 = mw->prev;
  if (pmVar1 == (mwData *)0x0) {
    if (mwHead != mw) {
      mwWrite("internal: <%ld> %s(%d), MW-%p: link1 NULL, but not head\n",mwCounter,file,
              (ulong)(uint)line,mw);
    }
    pmVar2 = mw->next;
    mwHead = pmVar2;
  }
  else if (pmVar1->next == mw) {
    pmVar2 = mw->next;
    pmVar1->next = pmVar2;
  }
  else {
    mwWrite("internal: <%ld> %s(%d), MW-%p: link1 failure\n",mwCounter,file,(ulong)(uint)line,mw);
    pmVar2 = mw->next;
  }
  if (pmVar2 == (mwData *)0x0) {
    if (mwTail != mw) {
      mwWrite("internal: <%ld> %s(%d), MW-%p: link2 NULL, but not tail\n",mwCounter,file,
              (ulong)(uint)line,mw);
    }
    mwTail = mw->prev;
  }
  else {
    if (pmVar2->prev != mw) {
      mwWrite("internal: <%ld> %s(%d), MW-%p: link2 failure\n",mwCounter,file,(ulong)(uint)line,mw);
      return;
    }
    pmVar2->prev = mw->prev;
  }
  return;
}

Assistant:

static void mwUnlink(mwData *mw, const char *file, int line)
{
	if (mw->prev == NULL) {
		if (mwHead != mw)
			mwWrite("internal: <%ld> %s(%d), MW-%p: link1 NULL, but not head\n",
					mwCounter, file, line, mw);
		mwHead = mw->next;
	} else {
		if (mw->prev->next != mw)
			mwWrite("internal: <%ld> %s(%d), MW-%p: link1 failure\n",
					mwCounter, file, line, mw);
		else {
			mw->prev->next = mw->next;
		}
	}
	if (mw->next == NULL) {
		if (mwTail != mw)
			mwWrite("internal: <%ld> %s(%d), MW-%p: link2 NULL, but not tail\n",
					mwCounter, file, line, mw);
		mwTail = mw->prev;
	} else {
		if (mw->next->prev != mw)
			mwWrite("internal: <%ld> %s(%d), MW-%p: link2 failure\n",
					mwCounter, file, line, mw);
		else {
			mw->next->prev = mw->prev;
		}
	}
}